

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerialQueue.cpp
# Opt level: O1

void __thiscall llbuild::basic::SerialQueue::sync(SerialQueue *this)

{
  SerialQueueImpl *this_00;
  long in_RSI;
  bool isComplete;
  condition_variable cv;
  char local_c9;
  undefined8 local_c8;
  undefined8 uStack_c0;
  code *local_b8;
  undefined8 uStack_b0;
  _Any_data local_a8;
  code *local_98;
  code *pcStack_90;
  condition_variable local_88 [48];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  this_00 = (SerialQueueImpl *)this->impl;
  local_b8 = (code *)0x0;
  uStack_b0 = 0;
  local_c8 = 0;
  uStack_c0 = 0;
  if (*(code **)(in_RSI + 0x10) != (code *)0x0) {
    (**(code **)(in_RSI + 0x10))(&local_c8,in_RSI,2);
    uStack_b0 = *(undefined8 *)(in_RSI + 0x18);
    local_b8 = *(code **)(in_RSI + 0x10);
  }
  if (local_b8 != (code *)0x0) {
    std::condition_variable::condition_variable(local_88);
    local_48 = 0;
    uStack_40 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_38 = 0;
    local_c9 = '\0';
    local_98 = (code *)0x0;
    pcStack_90 = (code *)0x0;
    local_a8._M_unused._M_object = (void *)0x0;
    local_a8._8_8_ = 0;
    local_a8._M_unused._M_object = operator_new(0x20);
    *(undefined8 **)local_a8._M_unused._0_8_ = &local_c8;
    *(undefined8 **)((long)local_a8._M_unused._0_8_ + 8) = &local_58;
    *(char **)((long)local_a8._M_unused._0_8_ + 0x10) = &local_c9;
    *(condition_variable **)((long)local_a8._M_unused._0_8_ + 0x18) = local_88;
    pcStack_90 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Basic/SerialQueue.cpp:111:18)>
                 ::_M_invoke;
    local_98 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Basic/SerialQueue.cpp:111:18)>
               ::_M_manager;
    anon_unknown.dwarf_36a2dc::SerialQueueImpl::addOperation(this_00,(function<void_()> *)&local_a8)
    ;
    if (local_98 != (code *)0x0) {
      (*local_98)(&local_a8,&local_a8,__destroy_functor);
    }
    local_a8._8_8_ = local_a8._8_8_ & 0xffffffffffffff00;
    local_a8._M_unused._M_object = &local_58;
    std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&local_a8);
    local_a8._M_pod_data[8] = 1;
    if (local_c9 == '\0') {
      do {
        std::condition_variable::wait((unique_lock *)local_88);
      } while (local_c9 != '\x01');
    }
    if (local_a8._M_pod_data[8] == '\x01') {
      std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)&local_a8);
    }
    std::condition_variable::~condition_variable(local_88);
    if (local_b8 != (code *)0x0) {
      (*local_b8)(&local_c8,&local_c8,3);
    }
    return;
  }
  __assert_fail("fn",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Basic/SerialQueue.cpp"
                ,0x68,"void (anonymous namespace)::SerialQueueImpl::sync(std::function<void ()>)");
}

Assistant:

void SerialQueue::sync(std::function<void(void)> fn) {
  static_cast<SerialQueueImpl*>(impl)->sync(fn);
}